

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O2

void __thiscall
slang::ast::RangeSelectExpression::serializeTo
          (RangeSelectExpression *this,ASTSerializer *serializer)

{
  string_view sVar1;
  
  sVar1 = ast::toString(this->selectionKind);
  ASTSerializer::write(serializer,0xd,"selectionKind",sVar1._M_len);
  ASTSerializer::write(serializer,5,"value",(size_t)this->value_);
  ASTSerializer::write(serializer,4,"left",(size_t)this->left_);
  ASTSerializer::write(serializer,5,"right",(size_t)this->right_);
  return;
}

Assistant:

void RangeSelectExpression::serializeTo(ASTSerializer& serializer) const {
    serializer.write("selectionKind", toString(selectionKind));
    serializer.write("value", value());
    serializer.write("left", left());
    serializer.write("right", right());
}